

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_pcnt_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((env->active_fpu).fpr + ws));
  *(char *)((env->active_fpu).fpr + wd) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 1));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 1) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 2));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 2) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 3));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 3) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 4));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 4) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 5));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 5) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 6));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 6) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 7));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 7) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 8));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 8) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 9));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 9) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 10));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 10) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xb));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xb) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xc));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xd));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xd) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xe));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = (char)iVar1;
  iVar1 = msa_pcnt_df(0,(long)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xf));
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xf) = (char)iVar1;
  return;
}

Assistant:

void helper_msa_pcnt_b(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->b[0]  = msa_pcnt_df(DF_BYTE, pws->b[0]);
    pwd->b[1]  = msa_pcnt_df(DF_BYTE, pws->b[1]);
    pwd->b[2]  = msa_pcnt_df(DF_BYTE, pws->b[2]);
    pwd->b[3]  = msa_pcnt_df(DF_BYTE, pws->b[3]);
    pwd->b[4]  = msa_pcnt_df(DF_BYTE, pws->b[4]);
    pwd->b[5]  = msa_pcnt_df(DF_BYTE, pws->b[5]);
    pwd->b[6]  = msa_pcnt_df(DF_BYTE, pws->b[6]);
    pwd->b[7]  = msa_pcnt_df(DF_BYTE, pws->b[7]);
    pwd->b[8]  = msa_pcnt_df(DF_BYTE, pws->b[8]);
    pwd->b[9]  = msa_pcnt_df(DF_BYTE, pws->b[9]);
    pwd->b[10] = msa_pcnt_df(DF_BYTE, pws->b[10]);
    pwd->b[11] = msa_pcnt_df(DF_BYTE, pws->b[11]);
    pwd->b[12] = msa_pcnt_df(DF_BYTE, pws->b[12]);
    pwd->b[13] = msa_pcnt_df(DF_BYTE, pws->b[13]);
    pwd->b[14] = msa_pcnt_df(DF_BYTE, pws->b[14]);
    pwd->b[15] = msa_pcnt_df(DF_BYTE, pws->b[15]);
}